

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

void __thiscall
Js::FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData
          (FunctionCodeGenRuntimeData *this,FunctionBody *functionBody)

{
  nullptr_t local_28;
  nullptr_t local_20;
  FunctionBody *local_18;
  FunctionBody *functionBody_local;
  FunctionCodeGenRuntimeData *this_local;
  
  local_18 = functionBody;
  functionBody_local = (FunctionBody *)this;
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&this->functionBody,functionBody);
  InlineCachePointerArray<Js::InlineCache>::InlineCachePointerArray(&this->clonedInlineCaches);
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::WriteBarrierPtr
            (&this->inlinees,&local_20);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::WriteBarrierPtr
            (&this->ldFldInlinees);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::WriteBarrierPtr
            (&this->callbackInlinees);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::WriteBarrierPtr
            (&this->callApplyTargetInlinees);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr(&this->next,&local_28);
  return;
}

Assistant:

FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData(FunctionBody *const functionBody)
        : functionBody(functionBody), inlinees(nullptr), next(nullptr)
    {
    }